

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

void __thiscall QDebug::QDebug(QDebug *this,QtMsgType t)

{
  void *pvVar1;
  undefined8 *in_RDI;
  Stream *in_stack_ffffffffffffffe0;
  
  pvVar1 = operator_new(0x58);
  Stream::Stream(in_stack_ffffffffffffffe0,(QtMsgType)((ulong)pvVar1 >> 0x20));
  *in_RDI = pvVar1;
  return;
}

Assistant:

explicit QDebug(QtMsgType t) : stream(new Stream(t)) {}